

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TempInputTextScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  char *format_00;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  ImVec2 local_80;
  char local_78 [32];
  char local_58 [40];
  
  pIVar2 = GImGui;
  IVar1 = GImGui->TempInputTextId;
  if (IVar1 != id) {
    ClearActiveID();
  }
  format_00 = ImParseFormatTrimDecorations(format,local_58,0x20);
  DataTypeFormatString(local_78,0x20,data_type,p_data,format_00);
  ImStrTrimBlanks(local_78);
  (pIVar2->CurrentWindow->DC).CursorPos = bb->Min;
  flags = 0x200011;
  if ((data_type & 0xfffffffeU) == 8) {
    flags = 0x220010;
  }
  local_80.x = (bb->Max).x - (bb->Min).x;
  local_80.y = (bb->Max).y - (bb->Min).y;
  bVar3 = InputTextEx(label,(char *)0x0,local_78,0x20,&local_80,flags,(ImGuiInputTextCallback)0x0,
                      (void *)0x0);
  if (IVar1 != id) {
    if (pIVar2->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0xb2d,
                    "bool ImGui::TempInputTextScalar(const ImRect &, ImGuiID, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    pIVar2->TempInputTextId = id;
  }
  if (bVar3) {
    bVar3 = false;
    bVar4 = DataTypeApplyOpFromText
                      (local_78,(pIVar2->InputTextState).InitialTextA.Data,data_type,p_data,
                       (char *)0x0);
    if (bVar4) {
      MarkItemEdited(id);
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::TempInputTextScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format)
{
    ImGuiContext& g = *GImGui;

    // On the first frame, g.TempInputTextId == 0, then on subsequent frames it becomes == id.
    // We clear ActiveID on the first frame to allow the InputText() taking it back.
    const bool init = (g.TempInputTextId != id);
    if (init)
        ClearActiveID();

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    g.CurrentWindow->DC.CursorPos = bb.Min;
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, NULL, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (init)
    {
        // First frame we started displaying the InputText widget, we expect it to take the active id.
        IM_ASSERT(g.ActiveId == id);
        g.TempInputTextId = g.ActiveId;
    }
    if (value_changed)
    {
        value_changed = DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialTextA.Data, data_type, p_data, NULL);
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}